

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2FilterHandlers.cpp
# Opt level: O1

void __thiscall
SAX2SortAttributesFilter::startElement
          (SAX2SortAttributesFilter *this,XMLCh *uri,XMLCh *localname,XMLCh *qname,
          Attributes *attributes)

{
  wchar16 *pwVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLSize_t XVar3;
  undefined4 extraout_var_00;
  Attr *pAVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  XMLSize_t i;
  ulong uVar5;
  XMLSize_t XVar6;
  AttrList sortedList;
  BaseRefVectorOf<Attr> local_60;
  
  iVar2 = (*attributes->_vptr_Attributes[2])(attributes);
  XVar6 = CONCAT44(extraout_var,iVar2);
  local_60._vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_0010e408;
  local_60.fAdoptedElems = true;
  local_60.fCurCount = 0;
  local_60.fElemList = (Attr **)0x0;
  local_60.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
  local_60.fMaxCount = XVar6;
  local_60.fElemList =
       (Attr **)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x18))
                          (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,XVar6 * 8);
  if (XVar6 != 0) {
    XVar3 = 0;
    do {
      local_60.fElemList[XVar3] = (Attr *)0x0;
      XVar3 = XVar3 + 1;
    } while (XVar6 != XVar3);
  }
  local_60._vptr_BaseRefVectorOf = (_func_int **)&PTR__AttrList_0010e270;
  uVar5 = 0;
  do {
    iVar2 = (*attributes->_vptr_Attributes[2])(attributes);
    if (CONCAT44(extraout_var_00,iVar2) <= uVar5) {
      xercesc_4_0::SAX2XMLFilterImpl::startElement
                ((wchar16 *)this,uri,localname,(Attributes *)qname);
      xercesc_4_0::RefVectorOf<Attr>::~RefVectorOf((RefVectorOf<Attr> *)&local_60);
      return;
    }
    if (local_60.fCurCount == 0) {
      XVar6 = 0;
    }
    else {
      XVar6 = 0;
      do {
        pAVar4 = xercesc_4_0::BaseRefVectorOf<Attr>::elementAt(&local_60,XVar6);
        pwVar1 = pAVar4->qName;
        iVar2 = (*attributes->_vptr_Attributes[5])(attributes,uVar5);
        iVar2 = xercesc_4_0::XMLString::compareString
                          (pwVar1,(wchar16 *)CONCAT44(extraout_var_01,iVar2));
        if (-1 < iVar2) break;
        XVar6 = XVar6 + 1;
      } while (XVar6 < local_60.fCurCount);
    }
    pAVar4 = (Attr *)operator_new(0x28);
    iVar2 = (*attributes->_vptr_Attributes[5])(attributes,uVar5);
    pAVar4->qName = (XMLCh *)CONCAT44(extraout_var_02,iVar2);
    iVar2 = (*attributes->_vptr_Attributes[3])(attributes,uVar5);
    pAVar4->uri = (XMLCh *)CONCAT44(extraout_var_03,iVar2);
    iVar2 = (*attributes->_vptr_Attributes[4])(attributes,uVar5);
    pAVar4->localPart = (XMLCh *)CONCAT44(extraout_var_04,iVar2);
    iVar2 = (*attributes->_vptr_Attributes[7])(attributes,uVar5);
    pAVar4->value = (XMLCh *)CONCAT44(extraout_var_05,iVar2);
    iVar2 = (*attributes->_vptr_Attributes[6])(attributes,uVar5);
    pAVar4->attrType = (XMLCh *)CONCAT44(extraout_var_06,iVar2);
    xercesc_4_0::BaseRefVectorOf<Attr>::insertElementAt(&local_60,pAVar4,XVar6);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void SAX2SortAttributesFilter::startElement(const   XMLCh* const    uri,
                                            const   XMLCh* const    localname,
                                            const   XMLCh* const    qname,
                                            const   Attributes&		attributes)
{
    AttrList sortedList(attributes.getLength());
    for(XMLSize_t i=0;i<attributes.getLength();i++)
    {
        XMLSize_t j;
        for(j=0;j<sortedList.getLength();j++)
        {
            if(XMLString::compareString(sortedList.elementAt(j)->qName,attributes.getQName(i))>=0)
                break;
        }
        Attr* pClone=new Attr;
        pClone->qName       = attributes.getQName(i);
        pClone->uri         = attributes.getURI(i);
        pClone->localPart   = attributes.getLocalName(i);
        pClone->value       = attributes.getValue(i);
        pClone->attrType    = attributes.getType(i);
        sortedList.insertElementAt(pClone, j);
    }
    SAX2XMLFilterImpl::startElement(uri, localname, qname, sortedList);
}